

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpSectionDict
          (DictionaryPrinter *this,SectionDict *section_dict)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  TemplateDictionary *dict;
  long lVar3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  sorted_section_dict;
  
  p_Var2 = &sorted_section_dict._M_t._M_impl.super__Rb_tree_header;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&sorted_section_dict,section_dict);
  if ((_Rb_tree_header *)sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var4 = sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      puVar5 = *(undefined8 **)(*(long *)(p_Var4 + 2) + 8);
      puVar6 = puVar5;
      if (puVar5 != *(undefined8 **)(*(long *)(p_Var4 + 2) + 0x10)) {
        do {
          dict = (TemplateDictionary *)*puVar5;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"section ","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,*(long *)(p_Var4 + 1),
                     (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," (dict ","");
          lVar3 = *(long *)(*(long *)(p_Var4 + 2) + 8);
          GetDictNum_abi_cxx11_
                    (&local_80,this,((long)puVar6 - lVar3 >> 3) + 1,
                     *(long *)(*(long *)(p_Var4 + 2) + 0x10) - lVar3 >> 3);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,") -->\n","");
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          local_120._M_string_length = 0;
          local_120.field_2._M_local_buf[0] = '\0';
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          local_140._M_string_length = 0;
          local_140.field_2._M_local_buf[0] = '\0';
          IndentedWriter::Write
                    (&this->writer_,&local_c0,&local_e0,&local_100,&local_80,&local_a0,&local_120,
                     &local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((this->writer_).line_state_ != AT_BEGINNING) {
            __assert_fail("line_state_ == AT_BEGINNING",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                          ,0x50,"void ctemplate::IndentedWriter::Indent()");
          }
          piVar1 = &(this->writer_).current_indentation_;
          *piVar1 = *piVar1 + 2;
          DumpToString(this,dict);
          IndentedWriter::Dedent(&this->writer_);
          puVar5 = puVar5 + 1;
          puVar6 = puVar6 + 1;
        } while (puVar5 != *(undefined8 **)(*(long *)(p_Var4 + 2) + 0x10));
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &sorted_section_dict._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  ::~_Rb_tree(&sorted_section_dict._M_t);
  return;
}

Assistant:

void DumpSectionDict(const SectionDict& section_dict) {
    map<string, const DictVector*> sorted_section_dict;
    SortSections(&sorted_section_dict, section_dict);
    for (map<string, const DictVector*>::const_iterator it =
             sorted_section_dict.begin();
         it != sorted_section_dict.end(); ++it) {
      for (DictVector::const_iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* dict = *it2;
        writer_.Write("section ", it->first, " (dict ",
                      GetDictNum(it2 - it->second->begin() + 1,
                                 it->second->size()),
                      ") -->\n");
        writer_.Indent();
        DumpToString(*dict);
        writer_.Dedent();
      }
    }
  }